

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Letter.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  QStandardItem *pQVar2;
  TextElement *pTVar3;
  Element *pEVar4;
  QByteArrayView QVar5;
  PreviewDialog local_4c8 [8];
  PreviewDialog preview;
  QFlags<KDReports::HeaderLocation> local_494;
  QString local_490;
  QString local_478;
  TextElement local_460 [8];
  TextElement footerText;
  HLineElement local_448 [28];
  QFlags<KDReports::HeaderLocation> local_42c;
  QColor local_428;
  QString local_418;
  QString local_400;
  QString local_3e8;
  TextElement local_3d0 [8];
  TextElement signatureElement;
  QColor local_3b8;
  QString local_3a8;
  QString local_390;
  TextElement local_378 [8];
  TextElement body2Element;
  QColor local_360;
  AutoTableElement local_350 [8];
  AutoTableElement tableElement;
  QColor local_330;
  QString local_320;
  QString local_308;
  QString local_2f0;
  TextElement local_2d8 [8];
  TextElement bodyElement;
  QColor local_2c0;
  QString local_2b0;
  TextElement local_298 [8];
  TextElement titleElement;
  QColor local_280;
  QString local_270;
  QString local_258;
  QString local_240;
  TextElement local_228 [8];
  TextElement toElement;
  QColor local_210;
  QString local_200;
  QString local_1e8;
  QByteArrayView local_1d0;
  QString local_1c0;
  QString local_1a8;
  QString local_190;
  TextElement local_178 [8];
  TextElement fromElement;
  QString local_158;
  undefined1 local_139;
  QString local_138;
  undefined1 local_119;
  QString local_118;
  undefined1 local_f9;
  QString local_f8;
  undefined1 local_d9;
  QString local_d8;
  undefined1 local_b9;
  QString local_b8;
  int local_a0;
  undefined1 local_99;
  int row;
  undefined1 local_79;
  QString local_78;
  QStandardItemModel local_60 [8];
  QStandardItemModel model;
  Report local_40 [8];
  Report report;
  QApplication local_28 [8];
  QApplication app;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  QApplication::QApplication(local_28,(int *)&argv_local,argv,0x60204);
  KDReports::Report::Report(local_40,(QObject *)0x0);
  QStandardItemModel::QStandardItemModel(local_60,(QObject *)0x0);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  local_79 = 1;
  QObject::tr(&local_78,"Product",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&local_78);
  local_79 = 0;
  QStandardItemModel::setHorizontalHeaderItem((int)local_60,(QStandardItem *)0x0);
  QString::~QString(&local_78);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  local_99 = 1;
  QObject::tr((QString *)&row,"Release Date",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&row);
  local_99 = 0;
  QStandardItemModel::setHorizontalHeaderItem((int)local_60,(QStandardItem *)0x1);
  QString::~QString((QString *)&row);
  local_a0 = 0;
  pQVar2 = (QStandardItem *)operator_new(0x10);
  local_b9 = 1;
  QObject::tr(&local_b8,"KD Reports 1.0",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&local_b8);
  local_b9 = 0;
  QStandardItemModel::setItem((int)local_60,0,(QStandardItem *)0x0);
  QString::~QString(&local_b8);
  iVar1 = local_a0;
  local_a0 = local_a0 + 1;
  pQVar2 = (QStandardItem *)operator_new(0x10);
  local_d9 = 1;
  QObject::tr(&local_d8,"August 21, 2007",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&local_d8);
  local_d9 = 0;
  QStandardItemModel::setItem((int)local_60,iVar1,(QStandardItem *)0x1);
  QString::~QString(&local_d8);
  iVar1 = local_a0;
  pQVar2 = (QStandardItem *)operator_new(0x10);
  local_f9 = 1;
  QObject::tr(&local_f8,"KD Reports 1.1",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&local_f8);
  local_f9 = 0;
  QStandardItemModel::setItem((int)local_60,iVar1,(QStandardItem *)0x0);
  QString::~QString(&local_f8);
  iVar1 = local_a0;
  local_a0 = local_a0 + 1;
  pQVar2 = (QStandardItem *)operator_new(0x10);
  local_119 = 1;
  QObject::tr(&local_118,"November 25, 2008",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&local_118);
  local_119 = 0;
  QStandardItemModel::setItem((int)local_60,iVar1,(QStandardItem *)0x1);
  QString::~QString(&local_118);
  iVar1 = local_a0;
  pQVar2 = (QStandardItem *)operator_new(0x10);
  local_139 = 1;
  QObject::tr(&local_138,"KD Reports 1.2",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&local_138);
  local_139 = 0;
  QStandardItemModel::setItem((int)local_60,iVar1,(QStandardItem *)0x0);
  QString::~QString(&local_138);
  iVar1 = local_a0;
  local_a0 = local_a0 + 1;
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QObject::tr(&local_158,"October, 2009",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&local_158);
  QStandardItemModel::setItem((int)local_60,iVar1,(QStandardItem *)0x1);
  QString::~QString(&local_158);
  QString::QString(&local_190);
  KDReports::TextElement::TextElement(local_178,(QString *)&local_190);
  QString::~QString(&local_190);
  QString::QString(&local_1a8,"From:\n");
  pTVar3 = (TextElement *)KDReports::TextElement::operator<<(local_178,(QString *)&local_1a8);
  QByteArrayView::QByteArrayView<31ul>(&local_1d0,&anon_var_dwarf_e6);
  QVar5.m_data = (storage_type *)local_1d0.m_size;
  QVar5.m_size = (qsizetype)&local_1c0;
  QString::fromUtf8(QVar5);
  pTVar3 = (TextElement *)KDReports::TextElement::operator<<(pTVar3,(QString *)&local_1c0);
  QString::QString(&local_1e8,"Rysktorp\n");
  pTVar3 = (TextElement *)KDReports::TextElement::operator<<(pTVar3,(QString *)&local_1e8);
  QString::QString(&local_200,"Sweden\n");
  KDReports::TextElement::operator<<(pTVar3,(QString *)&local_200);
  QString::~QString(&local_200);
  QString::~QString(&local_1e8);
  QString::~QString(&local_1c0);
  QString::~QString(&local_1a8);
  QColor::QColor(&local_210);
  KDReports::Report::addElement((Element *)local_40,(AlignmentFlag)local_178,(QColor *)0x1);
  KDReports::Report::addVerticalSpacing(10.0);
  QString::QString(&local_240);
  KDReports::TextElement::TextElement(local_228,(QString *)&local_240);
  QString::~QString(&local_240);
  QString::QString(&local_258,"To:\n");
  pTVar3 = (TextElement *)KDReports::TextElement::operator<<(local_228,(QString *)&local_258);
  QString::QString(&local_270,"All Qt Users Out There In The World\n");
  KDReports::TextElement::operator<<(pTVar3,(QString *)&local_270);
  QString::~QString(&local_270);
  QString::~QString(&local_258);
  QColor::QColor(&local_280);
  KDReports::Report::addElement((Element *)local_40,(AlignmentFlag)local_228,(QColor *)0x1);
  KDReports::Report::addVerticalSpacing(10.0);
  QObject::tr(&local_2b0,
              "Ever wanted to create a printed report from within your Qt application?\nLook no further!"
              ,(char *)0x0,-1);
  KDReports::TextElement::TextElement(local_298,(QString *)&local_2b0);
  QString::~QString(&local_2b0);
  KDReports::TextElement::setPointSize(14.0);
  QColor::QColor(&local_2c0);
  KDReports::Report::addElement((Element *)local_40,(AlignmentFlag)local_298,(QColor *)0x84);
  KDReports::Report::addVerticalSpacing(10.0);
  QString::QString(&local_2f0);
  KDReports::TextElement::TextElement(local_2d8,(QString *)&local_2f0);
  QString::~QString(&local_2f0);
  KDReports::TextElement::setPointSize(10.0);
  QObject::tr(&local_308,"Dear KDAB Customers,\n",(char *)0x0,-1);
  KDReports::TextElement::operator<<(local_2d8,(QString *)&local_308);
  QString::~QString(&local_308);
  QString::QString(&local_320,
                   "we are happy to introduce the newest member of KDAB\'s line of industry leading software products: KD Reports. KD Reports is the Qt tool to easily create printable reports. It provides all necessary features for a variety of applications:\nReports can be created programmatically, using an easy to use C++ API, or data-driven, creating complete reports from XML sources. Report data can be retrieved from SQL data sources. If KDAB\'s KDChart package is available, reports can be garnished with different chart types. Watermarks, headers and footers are there as well. Reports can be previewed manually, directly send to be printer, or saved as PDF.\n"
                  );
  KDReports::TextElement::operator<<(local_2d8,(QString *)&local_320);
  QString::~QString(&local_320);
  QColor::QColor(&local_330);
  KDReports::Report::addElement((Element *)local_40,(AlignmentFlag)local_2d8,(QColor *)0x8);
  KDReports::AutoTableElement::AutoTableElement(local_350,(QAbstractItemModel *)local_60);
  KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(local_350,0));
  KDReports::AbstractTableElement::setBorder(1.0);
  QColor::QColor(&local_360);
  KDReports::Report::addElement((Element *)local_40,(AlignmentFlag)local_350,(QColor *)0x84);
  KDReports::Report::addVerticalSpacing(6.0);
  QString::QString(&local_390);
  KDReports::TextElement::TextElement(local_378,(QString *)&local_390);
  QString::~QString(&local_390);
  KDReports::TextElement::setPointSize(10.0);
  QString::QString(&local_3a8,
                   "Reporting is a rather general feature, and it seems a nice package providing this kind of functionality to complement Qt was looked for by many. We at KDAB hope to make the life of our customers more enjoyable with it. Let us know if we were successful!\n"
                  );
  KDReports::TextElement::operator<<(local_378,(QString *)&local_3a8);
  QString::~QString(&local_3a8);
  QColor::QColor(&local_3b8);
  KDReports::Report::addElement((Element *)local_40,(AlignmentFlag)local_378,(QColor *)0x8);
  KDReports::Report::addVerticalSpacing(30.0);
  QString::QString(&local_3e8);
  KDReports::TextElement::TextElement(local_3d0,(QString *)&local_3e8);
  QString::~QString(&local_3e8);
  QObject::tr(&local_400,"Cheers,\n",(char *)0x0,-1);
  pTVar3 = (TextElement *)KDReports::TextElement::operator<<(local_3d0,(QString *)&local_400);
  QObject::tr(&local_418,anon_var_dwarf_1b7,(char *)0x0,-1);
  KDReports::TextElement::operator<<(pTVar3,(QString *)&local_418);
  QString::~QString(&local_418);
  QString::~QString(&local_400);
  QColor::QColor(&local_428);
  KDReports::Report::addElement((Element *)local_40,(AlignmentFlag)local_3d0,(QColor *)0x1);
  QFlags<KDReports::HeaderLocation>::QFlags(&local_42c,AllPages);
  pEVar4 = (Element *)KDReports::Report::footer((QFlags *)local_40);
  KDReports::HLineElement::HLineElement(local_448);
  KDReports::Header::addElement(pEVar4,(AlignmentFlag)local_448);
  KDReports::HLineElement::~HLineElement(local_448);
  QString::QString(&local_478);
  KDReports::TextElement::TextElement(local_460,(QString *)&local_478);
  QString::~QString(&local_478);
  QString::QString(&local_490,"www.kdab.com | email: info@kdab.com | +46-563-540090");
  KDReports::TextElement::operator<<(local_460,(QString *)&local_490);
  QString::~QString(&local_490);
  KDReports::TextElement::setPointSize(8.0);
  QFlags<KDReports::HeaderLocation>::QFlags(&local_494,AllPages);
  pEVar4 = (Element *)KDReports::Report::footer((QFlags *)local_40);
  KDReports::Header::addElement(pEVar4,(AlignmentFlag)local_460);
  KDReports::PreviewDialog::PreviewDialog(local_4c8,local_40,(QWidget *)0x0);
  argv_local._4_4_ = QDialog::exec();
  KDReports::PreviewDialog::~PreviewDialog(local_4c8);
  KDReports::TextElement::~TextElement(local_460);
  KDReports::TextElement::~TextElement(local_3d0);
  KDReports::TextElement::~TextElement(local_378);
  KDReports::AutoTableElement::~AutoTableElement(local_350);
  KDReports::TextElement::~TextElement(local_2d8);
  KDReports::TextElement::~TextElement(local_298);
  KDReports::TextElement::~TextElement(local_228);
  KDReports::TextElement::~TextElement(local_178);
  QStandardItemModel::~QStandardItemModel(local_60);
  KDReports::Report::~Report(local_40);
  QApplication::~QApplication(local_28);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    QApplication app(argc, argv);

    // Create a report
    KDReports::Report report;

    // create a table:
    QStandardItemModel model;
    model.setHorizontalHeaderItem(0, new QStandardItem(QObject::tr("Product")));
    model.setHorizontalHeaderItem(1, new QStandardItem(QObject::tr("Release Date")));
    int row = 0;
    model.setItem(row, 0, new QStandardItem(QObject::tr("KD Reports 1.0")));
    model.setItem(row++, 1, new QStandardItem(QObject::tr("August 21, 2007")));
    model.setItem(row, 0, new QStandardItem(QObject::tr("KD Reports 1.1")));
    model.setItem(row++, 1, new QStandardItem(QObject::tr("November 25, 2008")));
    model.setItem(row, 0, new QStandardItem(QObject::tr("KD Reports 1.2")));
    model.setItem(row++, 1, new QStandardItem(QObject::tr("October, 2009")));

    // Add From: and To: information:
    KDReports::TextElement fromElement;
    fromElement << "From:\n"
                << QString::fromUtf8("Klarälvdalens Datakonsult AB\n") << "Rysktorp\n"
                << "Sweden\n";
    report.addElement(fromElement);
    report.addVerticalSpacing(10);
    KDReports::TextElement toElement;
    toElement << "To:\n"
              << "All Qt Users Out There In The World\n";
    report.addElement(toElement);
    report.addVerticalSpacing(10);

    // Add a text element for the title
    KDReports::TextElement titleElement(QObject::tr("Ever wanted to create a printed report from within your Qt application?\nLook no further!"));
    titleElement.setPointSize(14);
    report.addElement(titleElement, Qt::AlignCenter);

    // A bit of spacing (10 mm)
    report.addVerticalSpacing(10);

    // Add another text element, demonstrating "<<" operator
    KDReports::TextElement bodyElement;
    bodyElement.setPointSize(10);
    bodyElement << QObject::tr("Dear KDAB Customers,\n");
    bodyElement << "we are happy to introduce the newest member of KDAB's line of industry leading software"
                   " products: KD Reports. KD Reports is the Qt tool to easily create printable reports. It "
                   "provides all necessary features for a variety of applications:\n"
                   "Reports can be created programmatically, using an easy to use C++ API, or data-driven, "
                   "creating complete reports from XML sources. Report data "
                   "can be retrieved from SQL data sources. If KDAB's KDChart package is available, reports "
                   "can be garnished with different chart types. Watermarks, headers and footers are there "
                   "as well. Reports can be previewed manually, directly send to be printer, or saved as "
                   "PDF.\n";
    report.addElement(bodyElement, Qt::AlignJustify);

    // release date table:
    KDReports::AutoTableElement tableElement(&model);
    tableElement.setVerticalHeaderVisible(false);
    tableElement.setBorder(1);
    report.addElement(tableElement, Qt::AlignCenter);
    report.addVerticalSpacing(6);

    KDReports::TextElement body2Element;
    body2Element.setPointSize(10);
    body2Element << "Reporting is a rather general feature, and it seems a nice package providing this kind "
                    "of functionality to complement Qt was looked for by many. We at KDAB hope to make the "
                    "life of our customers more enjoyable with it. Let us know if we were successful!\n";
    report.addElement(body2Element, Qt::AlignJustify);
    report.addVerticalSpacing(30);
    KDReports::TextElement signatureElement;
    signatureElement << QObject::tr("Cheers,\n") << QObject::tr("Klarälvdalens Datakonsult AB, Platform-independent software solutions");

    report.addElement(signatureElement);

    // add footer with contact information:
    report.footer().addElement(KDReports::HLineElement());
    KDReports::TextElement footerText;
    footerText << "www.kdab.com | email: info@kdab.com | +46-563-540090";
    footerText.setPointSize(8);
    report.footer().addElement(footerText, Qt::AlignCenter);

    // To show a print preview:
    KDReports::PreviewDialog preview(&report);
    return preview.exec();
}